

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall httplib::Server::~Server(Server *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  
  this->_vptr_Server = (_func_int **)&PTR__Server_001bf308;
  p_Var2 = (this->header_writer_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->header_writer_,(_Any_data *)&this->header_writer_,
              __destroy_functor);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->default_headers_)._M_t);
  p_Var2 = (this->socket_options_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->socket_options_,(_Any_data *)&this->socket_options_,
              __destroy_functor);
  }
  p_Var2 = (this->logger_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->logger_,(_Any_data *)&this->logger_,__destroy_functor);
  }
  p_Var2 = (this->expect_100_continue_handler_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->expect_100_continue_handler_,
              (_Any_data *)&this->expect_100_continue_handler_,__destroy_functor);
  }
  p_Var2 = (this->post_routing_handler_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->post_routing_handler_,(_Any_data *)&this->post_routing_handler_,
              __destroy_functor);
  }
  p_Var2 = (this->pre_routing_handler_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->pre_routing_handler_,(_Any_data *)&this->pre_routing_handler_,
              __destroy_functor);
  }
  p_Var2 = (this->exception_handler_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->exception_handler_,(_Any_data *)&this->exception_handler_,
              __destroy_functor);
  }
  p_Var2 = (this->error_handler_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->error_handler_,(_Any_data *)&this->error_handler_,
              __destroy_functor);
  }
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->options_handlers_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::~vector(&this->delete_handlers_for_content_reader_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->delete_handlers_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::~vector(&this->patch_handlers_for_content_reader_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->patch_handlers_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::~vector(&this->put_handlers_for_content_reader_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->put_handlers_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::~vector(&this->post_handlers_for_content_reader_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->post_handlers_);
  std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->get_handlers_);
  p_Var2 = (this->file_request_handler_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->file_request_handler_,(_Any_data *)&this->file_request_handler_,
              __destroy_functor);
  }
  pcVar3 = (this->default_file_mimetype_)._M_dataplus._M_p;
  paVar1 = &(this->default_file_mimetype_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->file_extension_and_mimetype_map_)._M_t);
  std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>::
  ~vector(&this->base_dirs_);
  p_Var2 = (this->new_task_queue).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->new_task_queue,(_Any_data *)&this->new_task_queue,
              __destroy_functor);
  }
  return;
}

Assistant:

inline Server::~Server() {}